

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O1

xmlParserInputBufferPtr xmlAllocParserInputBuffer(xmlCharEncoding enc)

{
  xmlParserInputBufferPtr pxVar1;
  int *piVar2;
  xmlBufPtr buf;
  xmlCharEncodingHandlerPtr pxVar3;
  xmlBufPtr pxVar4;
  
  pxVar1 = (xmlParserInputBufferPtr)(*xmlMalloc)(0x40);
  if (pxVar1 == (xmlParserInputBufferPtr)0x0) {
    pxVar1 = (xmlParserInputBufferPtr)0x0;
    __xmlSimpleError(8,2,(xmlNodePtr)0x0,(char *)0x0,"creating input buffer");
  }
  else {
    pxVar1->compressed = 0;
    pxVar1->error = 0;
    pxVar1->rawconsumed = 0;
    pxVar1->buffer = (xmlBufPtr)0x0;
    pxVar1->raw = (xmlBufPtr)0x0;
    pxVar1->closecallback = (xmlInputCloseCallback)0x0;
    pxVar1->encoder = (xmlCharEncodingHandlerPtr)0x0;
    pxVar1->context = (void *)0x0;
    pxVar1->readcallback = (xmlInputReadCallback)0x0;
    piVar2 = __xmlDefaultBufferSize();
    buf = xmlBufCreateSize((long)*piVar2 * 2);
    pxVar1->buffer = buf;
    if (buf == (xmlBufPtr)0x0) {
      (*xmlFree)(pxVar1);
      pxVar1 = (xmlParserInputBufferPtr)0x0;
    }
    else {
      pxVar4 = (xmlBufPtr)0x0;
      xmlBufSetAllocationScheme(buf,XML_BUFFER_ALLOC_DOUBLEIT);
      pxVar3 = xmlGetCharEncodingHandler(enc);
      pxVar1->encoder = pxVar3;
      if (pxVar3 != (xmlCharEncodingHandlerPtr)0x0) {
        piVar2 = __xmlDefaultBufferSize();
        pxVar4 = xmlBufCreateSize((long)*piVar2 * 2);
      }
      pxVar1->raw = pxVar4;
      pxVar1->context = (void *)0x0;
      pxVar1->readcallback = (xmlInputReadCallback)0x0;
      pxVar1->closecallback = (xmlInputCloseCallback)0x0;
      pxVar1->compressed = -1;
      pxVar1->rawconsumed = 0;
    }
  }
  return pxVar1;
}

Assistant:

xmlParserInputBufferPtr
xmlAllocParserInputBuffer(xmlCharEncoding enc) {
    xmlParserInputBufferPtr ret;

    ret = (xmlParserInputBufferPtr) xmlMalloc(sizeof(xmlParserInputBuffer));
    if (ret == NULL) {
	xmlIOErrMemory("creating input buffer");
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlParserInputBuffer));
    ret->buffer = xmlBufCreateSize(2 * xmlDefaultBufferSize);
    if (ret->buffer == NULL) {
        xmlFree(ret);
	return(NULL);
    }
    xmlBufSetAllocationScheme(ret->buffer, XML_BUFFER_ALLOC_DOUBLEIT);
    ret->encoder = xmlGetCharEncodingHandler(enc);
    if (ret->encoder != NULL)
        ret->raw = xmlBufCreateSize(2 * xmlDefaultBufferSize);
    else
        ret->raw = NULL;
    ret->readcallback = NULL;
    ret->closecallback = NULL;
    ret->context = NULL;
    ret->compressed = -1;
    ret->rawconsumed = 0;

    return(ret);
}